

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

int Ivy_FastMapNodeDelay(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar4 = (char *)((long)*(int *)((long)pAig->pData + 8) * (long)pObj->Id +
                   *(long *)((long)pAig->pData + 0x10));
  iVar3 = 0;
  for (lVar5 = 0; lVar5 < *pcVar4; lVar5 = lVar5 + 1) {
    pIVar2 = Ivy_ManObj(pAig,*(int *)(pcVar4 + lVar5 * 4 + 0xc));
    iVar1 = (int)*(short *)(*(long *)((long)pAig->pData + 0x10) + 8 +
                           (long)*(int *)((long)pAig->pData + 8) * (long)pIVar2->Id);
    if (iVar3 <= iVar1) {
      iVar3 = iVar1;
    }
  }
  return iVar3 + 1;
}

Assistant:

int Ivy_FastMapNodeDelay( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    Ivy_Supp_t * pSupp, * pSuppF;
    int c, Delay = 0;
    pSupp = Ivy_ObjSupp( pAig, pObj );
    for ( c = 0; c < pSupp->nSize; c++ )
    {
        pSuppF = Ivy_ObjSupp( pAig, Ivy_ManObj(pAig, pSupp->pArray[c]) );
        Delay = IVY_MAX( Delay, pSuppF->Delay );
    }
    return 1 + Delay;
}